

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall
restincurl::RequestBuilder::SendFileAsMimeData
          (RequestBuilder *this,string *path,string *name,string *remoteName,string *mimeType)

{
  bool bVar1;
  Exception *this_00;
  pointer this_01;
  allocator local_51;
  string local_50 [32];
  string *local_30;
  string *mimeType_local;
  string *remoteName_local;
  string *name_local;
  string *path_local;
  RequestBuilder *this_local;
  
  local_30 = mimeType;
  mimeType_local = remoteName;
  remoteName_local = name;
  name_local = path;
  path_local = (string *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (!bVar1) {
    __assert_fail("request_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x55e,
                  "RequestBuilder &restincurl::RequestBuilder::SendFileAsMimeData(const std::string &, const std::string &, const std::string &, const std::string &)"
                 );
  }
  if (this->request_type_ == POST_MIME) {
    if (this->request_type_ != POST_MIME) {
      this_00 = (Exception *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_50,"Must use PostMime operation to add mime attachments",&local_51);
      Exception::Exception(this_00,(string *)local_50);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    this_01 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
              operator->(&this->request_);
    Request::AddFileAsMimeData(this_01,name_local,remoteName_local,mimeType_local,local_30);
    return this;
  }
  __assert_fail("request_type_ == RequestType::POST_MIME",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x55f,
                "RequestBuilder &restincurl::RequestBuilder::SendFileAsMimeData(const std::string &, const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

RequestBuilder& SendFileAsMimeData(const std::string& path,
                               const std::string& name = {},
                               const std::string& remoteName = {},
                               const std::string& mimeType = {}) {
            assert(request_);
            assert(request_type_ == RequestType::POST_MIME);
            if (request_type_ != RequestType::POST_MIME) {
                throw Exception{"Must use PostMime operation to add mime attachments"};
            }
            request_->AddFileAsMimeData(path, name, remoteName, mimeType);
            return *this;
        }